

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  CallInfo *pCVar3;
  GCObject *o;
  GCObject *pGVar4;
  byte bVar5;
  
  pgVar1 = L->l_G;
  pGVar4 = (GCObject *)&L->openupval;
  while ((pGVar2 = (pGVar4->gch).next, pGVar2 != (GCObject *)0x0 && (level <= (pGVar2->h).array))) {
    pGVar4 = pGVar2;
    if ((pGVar2->h).array == level) {
      bVar5 = (pGVar2->gch).marked ^ 3;
      if (((pgVar1->currentwhite ^ 3) & bVar5) == 0) {
        (pGVar2->gch).marked = bVar5;
      }
      return (UpVal *)pGVar2;
    }
  }
  pGVar4 = luaC_newobj(L,10,0x28,(GCObject **)pGVar4,0);
  (pGVar4->th).top = level;
  (pGVar4->h).node = (Node *)&pgVar1->uvhead;
  pCVar3 = (CallInfo *)(pgVar1->uvhead).u.l.next;
  (pGVar4->th).ci = pCVar3;
  pCVar3->next = (CallInfo *)pGVar4;
  (pgVar1->uvhead).u.l.next = (UpVal *)pGVar4;
  return (UpVal *)pGVar4;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  global_State *g = G(L);
  GCObject **pp = &L->openupval;
  UpVal *p;
  UpVal *uv;
  while (*pp != NULL && (p = gco2uv(*pp))->v >= level) {
    GCObject *o = obj2gco(p);
    lua_assert(p->v != &p->u.value);
    lua_assert(!isold(o) || isold(obj2gco(L)));
    if (p->v == level) {  /* found a corresponding upvalue? */
      if (isdead(g, o))  /* is it dead? */
        changewhite(o);  /* resurrect it */
      return p;
    }
    pp = &p->next;
  }
  /* not found: create a new one */
  uv = &luaC_newobj(L, LUA_TUPVAL, sizeof(UpVal), pp, 0)->uv;
  uv->v = level;  /* current value lives in the stack */
  uv->u.l.prev = &g->uvhead;  /* double link it in `uvhead' list */
  uv->u.l.next = g->uvhead.u.l.next;
  uv->u.l.next->u.l.prev = uv;
  g->uvhead.u.l.next = uv;
  lua_assert(uv->u.l.next->u.l.prev == uv && uv->u.l.prev->u.l.next == uv);
  return uv;
}